

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

void __thiscall
asio::execution::detail::any_executor_base::any_executor_base
          (any_executor_base *this,any_executor_base *other)

{
  bool bVar1;
  any_executor_base *in_RSI;
  long in_RDI;
  
  bVar1 = operator!(in_RSI);
  if (bVar1) {
    *(undefined8 *)(in_RDI + 0x18) = 0;
    *(undefined8 *)(in_RDI + 0x20) = 0;
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  else {
    *(object_fns **)(in_RDI + 0x18) = in_RSI->object_fns_;
    *(target_fns **)(in_RDI + 0x28) = in_RSI->target_fns_;
    (**(code **)(*(long *)(in_RDI + 0x18) + 8))(in_RDI,in_RSI);
  }
  return;
}

Assistant:

any_executor_base(const any_executor_base& other) noexcept
  {
    if (!!other)
    {
      object_fns_ = other.object_fns_;
      target_fns_ = other.target_fns_;
      object_fns_->copy(*this, other);
    }
    else
    {
      object_fns_ = 0;
      target_ = 0;
      target_fns_ = 0;
    }
  }